

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O0

ProjectSettings * __thiscall
RuntimeObjectSystem::GetProject(RuntimeObjectSystem *this,unsigned_short projectId_)

{
  size_type sVar1;
  reference pvVar2;
  unsigned_short projectId__local;
  RuntimeObjectSystem *this_local;
  
  sVar1 = std::
          vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
          ::size(&this->m_Projects);
  if (sVar1 <= projectId_) {
    std::
    vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
    ::resize(&this->m_Projects,(long)(int)(projectId_ + 1));
  }
  pvVar2 = std::
           vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ::operator[](&this->m_Projects,(ulong)projectId_);
  return pvVar2;
}

Assistant:

RuntimeObjectSystem::ProjectSettings& RuntimeObjectSystem::GetProject( unsigned short projectId_ )
{
    if( projectId_ >= m_Projects.size() )
    {
        m_Projects.resize(projectId_ + 1);
    }
    return m_Projects[ projectId_ ];
}